

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O1

SQRESULT sq_getdefaultdelegate(HSQUIRRELVM v,SQObjectType t)

{
  SQSharedState *pSVar1;
  SQObjectPtr *o;
  
  pSVar1 = v->_sharedstate;
  if ((int)t < 0x8000400) {
    if ((int)t < 0x8000040) {
      if ((t == OT_INTEGER) || (t == OT_FLOAT)) {
        o = &pSVar1->_number_default_delegate;
      }
      else {
        if (t != OT_STRING) {
LAB_00114c00:
          sq_throwerror(v,"the type doesn\'t have a default delegate");
          return -1;
        }
        o = &pSVar1->_string_default_delegate;
      }
    }
    else if (t == OT_ARRAY) {
      o = &pSVar1->_array_default_delegate;
    }
    else {
      if ((t != OT_CLOSURE) && (t != OT_NATIVECLOSURE)) goto LAB_00114c00;
      o = &pSVar1->_closure_default_delegate;
    }
  }
  else if ((int)t < 0x8010000) {
    if (t == OT_GENERATOR) {
      o = &pSVar1->_generator_default_delegate;
    }
    else if (t == OT_THREAD) {
      o = &pSVar1->_thread_default_delegate;
    }
    else {
      if (t != OT_CLASS) goto LAB_00114c00;
      o = &pSVar1->_class_default_delegate;
    }
  }
  else if (t == OT_WEAKREF) {
    o = &pSVar1->_weakref_default_delegate;
  }
  else if (t == OT_INSTANCE) {
    o = &pSVar1->_instance_default_delegate;
  }
  else {
    if (t != OT_TABLE) goto LAB_00114c00;
    o = &pSVar1->_table_default_delegate;
  }
  SQVM::Push(v,o);
  return 0;
}

Assistant:

SQRESULT sq_getdefaultdelegate(HSQUIRRELVM v,SQObjectType t)
{
    SQSharedState *ss = _ss(v);
    switch(t) {
    case OT_TABLE: v->Push(ss->_table_default_delegate); break;
    case OT_ARRAY: v->Push(ss->_array_default_delegate); break;
    case OT_STRING: v->Push(ss->_string_default_delegate); break;
    case OT_INTEGER: case OT_FLOAT: v->Push(ss->_number_default_delegate); break;
    case OT_GENERATOR: v->Push(ss->_generator_default_delegate); break;
    case OT_CLOSURE: case OT_NATIVECLOSURE: v->Push(ss->_closure_default_delegate); break;
    case OT_THREAD: v->Push(ss->_thread_default_delegate); break;
    case OT_CLASS: v->Push(ss->_class_default_delegate); break;
    case OT_INSTANCE: v->Push(ss->_instance_default_delegate); break;
    case OT_WEAKREF: v->Push(ss->_weakref_default_delegate); break;
    default: return sq_throwerror(v,_SC("the type doesn't have a default delegate"));
    }
    return SQ_OK;
}